

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall ChatServer::incomingData(ChatServer *this,Stream *stream)

{
  mapped_type *__lhs;
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  string line;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Stream *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_40 = stream;
  readLine_abi_cxx11_(&local_80,stream);
  __lhs = std::
          map<Dashel::Stream_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&this->nicks,&local_40);
  std::operator+(&local_60,__lhs," : ");
  std::operator+(&local_38,&local_60,&local_80);
  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"* Message from ");
  std::operator<<(poVar1,(string *)&local_80);
  for (p_Var2 = *(_Rb_tree_node_base **)&this->field_0x60;
      p_Var2 != (_Rb_tree_node_base *)&this->field_0x50;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    sendString(*(Stream **)(p_Var2 + 1),&local_80);
  }
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void incomingData(Stream* stream)
	{
		string line = readLine(stream);
		const string& nick = nicks[stream];
		line = nick + " : " + line;
		cout << "* Message from " << line;

		for (StreamsSet::iterator it = dataStreams.begin(); it != dataStreams.end(); ++it)
			sendString((*it), line);
	}